

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

Box2i __thiscall
Imf_2_5::TiledInputFile::dataWindowForTile(TiledInputFile *this,int dx,int dy,int lx,int ly)

{
  bool bVar1;
  ArgExc *this_00;
  int in_ECX;
  int in_EDX;
  TiledInputFile *in_RSI;
  Vec2<int> in_RDI;
  int in_R8D;
  int in_R9D;
  Box2i BVar2;
  stringstream _iex_replace_s;
  BaseExc *e;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  TileDescription *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  
  bVar1 = isValidTile(in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  if (!bVar1) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,"Arguments not in valid range.");
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  BVar2 = Imf_2_5::dataWindowForTile
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  BVar2.min = in_RDI;
  return BVar2;
}

Assistant:

Box2i
TiledInputFile::dataWindowForTile (int dx, int dy, int lx, int ly) const
{
    try
    {
	if (!isValidTile (dx, dy, lx, ly))
	    throw IEX_NAMESPACE::ArgExc ("Arguments not in valid range.");

        return OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                _data->tileDesc,
                _data->minX, _data->maxX,
                _data->minY, _data->maxY,
                dx, dy, lx, ly);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling dataWindowForTile() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}